

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall common_log::~common_log(common_log *this)

{
  pointer pcVar1;
  
  pause(this);
  if ((FILE *)this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
  }
  pcVar1 = (this->cur).msg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)(this->cur).msg.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar1);
  }
  std::vector<common_log_entry,_std::allocator<common_log_entry>_>::~vector(&this->entries);
  std::condition_variable::~condition_variable(&this->cv);
  if ((this->thrd)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

~common_log() {
        pause();
        if (file) {
            fclose(file);
        }
    }